

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,4,4>,tcu::Vector<float,4>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined8 *puVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_4>_> *pVVar5;
  pointer pcVar6;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar7;
  undefined8 uVar8;
  PrecisionCase *pPVar9;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  *pVVar10;
  bool bVar11;
  bool bVar12;
  ContextType type;
  int iVar13;
  uint uVar14;
  _Rb_tree_node_base *p_Var15;
  char *__s;
  size_t sVar16;
  long *plVar17;
  ShaderExecutor *pSVar18;
  long lVar19;
  IVal *pIVar20;
  IVal *pIVar21;
  MessageBuilder *pMVar22;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  undefined1 *puVar24;
  Vector<float,_4> *val;
  size_t sVar25;
  double dVar26;
  long lVar27;
  byte bVar28;
  IVal in2;
  IVal in3;
  IVal in1;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  outputs;
  ostringstream os;
  FuncSet funcs;
  ostringstream oss;
  ShaderSpec spec;
  PrecisionCase *local_578;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  *local_570;
  string local_568;
  Statement *local_548;
  string local_540;
  size_t local_520;
  ulong local_518;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_510;
  FloatFormat *local_508;
  undefined1 local_500 [16];
  undefined1 local_4f0 [88];
  double local_498;
  Interval IStack_490;
  double local_478;
  double local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_468;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  local_438;
  undefined1 local_408 [8];
  pointer pVStack_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  VarType local_3e8 [3];
  ios_base local_398 [8];
  ios_base local_390 [256];
  undefined1 auStack_290 [8];
  undefined1 local_288 [16];
  _Base_ptr local_278;
  _Rb_tree_node_base *local_270;
  _Rb_tree_node_base *local_268;
  double local_260;
  undefined1 auStack_230 [8];
  undefined1 local_228 [8];
  undefined1 auStack_220 [8];
  undefined1 local_218 [24];
  float local_200;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_1f8;
  float local_1f0;
  ios_base local_1b8 [8];
  ios_base local_1b0 [264];
  undefined1 local_a8 [56];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  bVar28 = 0;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar25 = (long)pVVar4 - (long)pVVar3 >> 4;
  local_570 = variables;
  local_548 = stmt;
  local_510 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  ::Outputs(&local_438,sVar25);
  local_70._M_p = (pointer)&local_60;
  local_a8._0_4_ = GLSL_VERSION_300_ES;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  local_a8._32_8_ = (pointer)0x0;
  local_a8._40_8_ = (pointer)0x0;
  local_a8._48_8_ = (pointer)0x0;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_478 = (this->m_ctx).highpFormat.m_maxValue;
  local_498 = *(double *)&(this->m_ctx).highpFormat;
  IStack_490._0_8_ = *(undefined8 *)&(this->m_ctx).highpFormat.m_fractionBits;
  IStack_490.m_lo = *(double *)&(this->m_ctx).highpFormat.m_hasInf;
  IStack_490.m_hi = *(double *)&(this->m_ctx).highpFormat.m_exactPrecision;
  local_468._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_468._M_impl.super__Rb_tree_header._M_header;
  local_468._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_468._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_468._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_408 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_468._M_impl.super__Rb_tree_header._M_header._M_right =
       local_468._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_400);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_400,"Statement: ",0xb);
  (*local_548->_vptr_Statement[2])(local_548,(ostringstream *)&pVStack_400);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_578 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_400);
  std::ios_base::~ios_base(local_390);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  p_Var2 = (_Rb_tree_node_base *)(local_288 + 8);
  local_288._8_4_ = _S_red;
  local_278 = (_Base_ptr)0x0;
  local_260 = 0.0;
  local_520 = sVar25;
  local_270 = p_Var2;
  local_268 = p_Var2;
  (*local_548->_vptr_Statement[4])(local_548,local_288);
  if (local_270 != p_Var2) {
    p_Var15 = local_270;
    do {
      (**(code **)(**(long **)(p_Var15 + 1) + 0x30))(*(long **)(p_Var15 + 1),local_228);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != p_Var2);
  }
  pPVar9 = local_578;
  if (local_260 != 0.0) {
    local_408 = (undefined1  [8])((local_578->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_400);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_400,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_400,(char *)local_500._0_8_,local_500._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
      operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_400);
    std::ios_base::~ios_base(local_390);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_288);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_408,"precision ",10);
  __s = glu::getPrecisionName((pPVar9->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)((long)&local_578 + *(long *)((long)local_408 + -0x18)) + 0x170);
  }
  else {
    sVar16 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_408,__s,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_408," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_70,(string *)local_228);
  if (local_228 != (undefined1  [8])local_218) {
    operator_delete((void *)local_228,CONCAT44(local_218._4_4_,local_218._0_4_) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
  std::ios_base::~ios_base(local_398);
  type.super_ApiType.m_bits = (ApiType)(*((pPVar9->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_a8._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_578->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   "#extension ",&local_578->m_extension);
    plVar17 = (long *)std::__cxx11::string::append(local_228);
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 == paVar23) {
      local_3f8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_3f8._8_8_ = plVar17[3];
      local_408 = (undefined1  [8])&local_3f8;
    }
    else {
      local_3f8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_408 = (undefined1  [8])*plVar17;
    }
    pVStack_400 = (pointer)plVar17[1];
    *plVar17 = (long)paVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_408);
    if (local_408 != (undefined1  [8])&local_3f8) {
      operator_delete((void *)local_408,local_3f8._M_allocated_capacity + 1);
    }
    if (local_228 != (undefined1  [8])local_218) {
      operator_delete((void *)local_228,CONCAT44(local_218._4_4_,local_218._0_4_) + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 8),1);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_408,local_578,
             (local_570->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar8 = local_a8._8_8_;
  std::__cxx11::string::operator=((string *)local_a8._8_8_,(string *)local_408);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),local_3e8);
  glu::VarType::~VarType(local_3e8);
  if (local_408 != (undefined1  [8])&local_3f8) {
    operator_delete((void *)local_408,local_3f8._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 0x20),2);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_408,local_578,
             (local_570->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar8 = local_a8._32_8_;
  std::__cxx11::string::operator=((string *)(local_a8._32_8_ + 0x38),(string *)local_408);
  glu::VarType::operator=(&((pointer)(uVar8 + 0x38))->varType,local_3e8);
  glu::VarType::~VarType(local_3e8);
  if (local_408 != (undefined1  [8])&local_3f8) {
    operator_delete((void *)local_408,local_3f8._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,4,4>>
            ((Symbol *)local_408,local_578,
             (local_570->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr);
  uVar8 = local_a8._32_8_;
  std::__cxx11::string::operator=((string *)local_a8._32_8_,(string *)local_408);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),local_3e8);
  glu::VarType::~VarType(local_3e8);
  if (local_408 != (undefined1  [8])&local_3f8) {
    operator_delete((void *)local_408,local_3f8._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
  pPVar9 = local_578;
  (*local_548->_vptr_Statement[2])(local_548,local_408);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
  std::ios_base::~ios_base(local_398);
  std::__cxx11::string::operator=((string *)&local_50,(string *)local_228);
  if (local_228 != (undefined1  [8])local_218) {
    operator_delete((void *)local_228,CONCAT44(local_218._4_4_,local_218._0_4_) + 1);
  }
  pSVar18 = ShaderExecUtil::createExecutor
                      ((pPVar9->m_ctx).renderContext,(pPVar9->m_ctx).shaderType,
                       (ShaderSpec *)local_a8);
  sVar25 = local_520;
  local_408 = (undefined1  [8])
              (local_510->in0).
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pVStack_400 = (local_510->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_3f8._M_allocated_capacity =
       (size_type)
       (local_510->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3f8._8_8_ =
       (local_510->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228 = (undefined1  [8])
              local_438.out0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  auStack_220 = (undefined1  [8])
                local_438.out1.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (*pSVar18->_vptr_ShaderExecutor[3])
            (pSVar18,((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar13 = (*pSVar18->_vptr_ShaderExecutor[2])(pSVar18);
  if ((char)iVar13 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar18->_vptr_ShaderExecutor[5])(pSVar18);
  (*pSVar18->_vptr_ShaderExecutor[6])(pSVar18,sVar25 & 0xffffffff,local_408,local_228);
  local_508 = &(pPVar9->m_ctx).floatFormat;
  (*pSVar18->_vptr_ShaderExecutor[1])(pSVar18);
  lVar19 = 8;
  do {
    auStack_230[lVar19] = 0;
    *(undefined8 *)(local_228 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(auStack_220 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x68);
  lVar19 = 8;
  do {
    auStack_230[lVar19] = 0;
    *(undefined8 *)(local_228 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(auStack_220 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x68);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_408);
  pVVar10 = local_570;
  lVar19 = 8;
  do {
    auStack_290[lVar19] = 0;
    *(undefined8 *)(local_288 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_288 + lVar19 + 8) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x68);
  lVar19 = 8;
  do {
    auStack_290[lVar19] = 0;
    *(undefined8 *)(local_288 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_288 + lVar19 + 8) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x68);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_468,
             (local_570->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_228);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_468,
             (pVVar10->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_500);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_468,
             (pVVar10->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_568);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_468,
             (pVVar10->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_540);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_468,
             (pVVar10->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr,(IVal *)local_408);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_468,
             (pVVar10->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_288);
  if (pVVar4 == pVVar3) {
LAB_017a1716:
    local_408 = (undefined1  [8])((local_578->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_400);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_400,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_400);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_400," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4f0._80_8_ = &local_578->m_status;
    local_470 = (double)(sVar25 + (sVar25 == 0));
    dVar26 = 0.0;
    local_518 = 0;
    do {
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_408);
      lVar19 = 8;
      do {
        auStack_290[lVar19] = 0;
        *(undefined8 *)(local_288 + lVar19) = 0x7ff0000000000000;
        *(undefined8 *)(local_288 + lVar19 + 8) = 0xfff0000000000000;
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x68);
      lVar19 = 8;
      do {
        auStack_290[lVar19] = 0;
        *(undefined8 *)(local_288 + lVar19) = 0x7ff0000000000000;
        *(undefined8 *)(local_288 + lVar19 + 8) = 0xfff0000000000000;
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x68);
      if (((ulong)dVar26 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_578->super_TestCase).super_TestNode.m_testCtx);
      }
      pVVar3 = (local_510->in0).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + (long)dVar26;
      local_568._M_dataplus._M_p = *(pointer *)pVVar3->m_data;
      local_568._M_string_length = *(size_type *)(pVVar3->m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_500,local_508,(Vector<float,_4> *)&local_568);
      pVVar10 = local_570;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_228,local_508,(IVal *)local_500);
      pIVar20 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_468,
                           (pVVar10->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar22 = (MessageBuilder *)local_228;
      for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(TestLog **)pIVar20->m_data = pMVar22->m_log;
        pMVar22 = (MessageBuilder *)((long)pMVar22 + (ulong)bVar28 * -0x10 + 8);
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_468,
                 (pVVar10->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_468,
                 (pVVar10->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_468,
                 (pVVar10->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_200 = (float)(local_578->m_ctx).precision;
      local_218._16_8_ = local_508->m_maxValue;
      local_228 = *(undefined1 (*) [8])local_508;
      auStack_220 = *(undefined1 (*) [8])&local_508->m_fractionBits;
      local_218._0_4_ = local_508->m_hasInf;
      local_218._4_4_ = local_508->m_hasNaN;
      local_218._8_4_ = *(undefined4 *)&local_508->m_exactPrecision;
      local_218._12_4_ = *(undefined4 *)&local_508->field_0x1c;
      local_1f0 = 0.0;
      local_1f8 = &local_468;
      (*local_548->_vptr_Statement[3])(local_548,(MessageBuilder *)local_228);
      pIVar20 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_468,
                           (pVVar10->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_228,(FloatFormat *)&local_498,pIVar20);
      pMVar22 = (MessageBuilder *)local_228;
      pIVar20 = (IVal *)local_288;
      for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(TestLog **)pIVar20->m_data = pMVar22->m_log;
        pMVar22 = (MessageBuilder *)((long)pMVar22 + (ulong)bVar28 * -0x10 + 8);
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      bVar11 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_288,
                          local_438.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)dVar26);
      local_228 = (undefined1  [8])local_218;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_228,"Shader output 1 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check
                         ((ResultCollector *)local_4f0._80_8_,bVar11,(string *)local_228);
      pVVar10 = local_570;
      if (local_228 != (undefined1  [8])local_218) {
        operator_delete((void *)local_228,CONCAT44(local_218._4_4_,local_218._0_4_) + 1);
      }
      pIVar21 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_468,
                           (pVVar10->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)local_228,(FloatFormat *)&local_498,pIVar21);
      puVar24 = local_408;
      lVar19 = 0;
      pMVar22 = (MessageBuilder *)local_228;
      do {
        lVar27 = 0;
        do {
          *(undefined8 *)(puVar24 + lVar27 + 0x10) =
               *(undefined8 *)
                (&(pMVar22->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar27);
          puVar1 = (undefined8 *)((long)&pMVar22->m_log + lVar27);
          uVar8 = puVar1[1];
          *(undefined8 *)(puVar24 + lVar27) = *puVar1;
          *(undefined8 *)((long)(puVar24 + lVar27) + 8) = uVar8;
          lVar27 = lVar27 + 0x60;
        } while (lVar27 != 0x180);
        lVar19 = lVar19 + 1;
        puVar24 = puVar24 + 0x18;
        pMVar22 = (MessageBuilder *)
                  &(pMVar22->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      } while (lVar19 != 4);
      bVar12 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_408,
                          local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)dVar26);
      local_228 = (undefined1  [8])local_218;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_228,"Shader output 0 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check
                         ((ResultCollector *)local_4f0._80_8_,bVar12,(string *)local_228);
      if (local_228 != (undefined1  [8])local_218) {
        operator_delete((void *)local_228,CONCAT44(local_218._4_4_,local_218._0_4_) + 1);
      }
      pVVar10 = local_570;
      if (!bVar11 || !bVar12) {
        uVar14 = (int)local_518 + 1;
        local_518 = (ulong)uVar14;
        if ((int)uVar14 < 0x65) {
          local_228 = (undefined1  [8])((local_578->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_220);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"\t",1);
          pVVar5 = (pVVar10->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                   .m_ptr;
          val = (Vector<float,_4> *)local_4f0;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_500._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,(char *)local_500._0_8_,local_500._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220," = ",3);
          valueToString<tcu::Vector<float,4>>
                    (&local_568,(BuiltinPrecisionTests *)&local_498,
                     (FloatFormat *)
                     ((local_510->in0).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar26),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,local_568._M_dataplus._M_p,local_568._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          }
          if ((Vector<float,_4> *)local_500._0_8_ != (Vector<float,_4> *)local_4f0) {
            operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"\t",1);
          pVVar7 = (pVVar10->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                   .m_ptr;
          pIVar21 = (IVal *)local_4f0;
          pcVar6 = (pVVar7->m_name)._M_dataplus._M_p;
          local_500._0_8_ = pIVar21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar6,pcVar6 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,(char *)local_500._0_8_,local_500._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220," = ",3);
          valueToString<tcu::Matrix<float,4,4>>
                    (&local_568,(BuiltinPrecisionTests *)&local_498,
                     (FloatFormat *)
                     (local_438.out0.
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar26),
                     (Matrix<float,_4,_4> *)pIVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,local_568._M_dataplus._M_p,local_568._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,4,4>>
                    (&local_540,(BuiltinPrecisionTests *)&local_498,(FloatFormat *)local_408,pIVar21
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,local_540._M_dataplus._M_p,local_540._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != &local_540.field_2) {
            operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
            operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"\t",1);
          pVVar5 = (pVVar10->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_4f0;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_500._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,(char *)local_500._0_8_,local_500._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220," = ",3);
          valueToString<tcu::Vector<float,4>>
                    (&local_568,(BuiltinPrecisionTests *)&local_498,
                     (FloatFormat *)
                     (local_438.out1.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar26),
                     (Vector<float,_4> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,local_568._M_dataplus._M_p,local_568._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,4>>
                    (&local_540,(BuiltinPrecisionTests *)&local_498,(FloatFormat *)local_288,pIVar20
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_220,local_540._M_dataplus._M_p,local_540._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_220,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != &local_540.field_2) {
            operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
            operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_220);
          std::ios_base::~ios_base(local_1b0);
        }
      }
      dVar26 = (double)((long)dVar26 + 1);
    } while (dVar26 != local_470);
    iVar13 = (int)local_518;
    if (iVar13 < 0x65) {
      if (iVar13 == 0) goto LAB_017a1716;
    }
    else {
      local_408 = (undefined1  [8])((local_578->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_400);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_400,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_400,iVar13 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_400," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_400);
      std::ios_base::~ios_base(local_390);
    }
    local_408 = (undefined1  [8])((local_578->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_400);
    std::ostream::operator<<((ostringstream *)&pVStack_400,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_400,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_400);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_400," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_400);
  std::ios_base::~ios_base(local_390);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 8));
  if (local_438.out1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_438.out0.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}